

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::generateLogon(Session *this,Message *aLogon)

{
  pointer pcVar1;
  FieldBase *field;
  SEQNUM SVar2;
  Message logon;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  undefined1 local_1e0 [16];
  _Alloc_hider local_1d0;
  char local_1c0 [16];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  field_metrics local_190;
  Message local_188;
  
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,&MsgType_Logon,0x1d0a7f);
  local_1e0._0_8_ = &PTR__FieldBase_001f8470;
  local_1e0._8_4_ = 0x23;
  local_1d0._M_p = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_200,local_1f8 + (long)local_200);
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190.m_length = 0;
  local_190.m_checksum = 0;
  local_1e0._0_8_ = &PTR__FieldBase_001f9500;
  local_1b0._M_p = (pointer)&local_1a0;
  newMessage(&local_188,this,(MsgType *)local_1e0);
  FieldBase::~FieldBase((FieldBase *)local_1e0);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  IntField::IntField((IntField *)local_1e0,0x62,0);
  local_1e0._0_8_ = &PTR__FieldBase_001f9ff0;
  FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_1e0,true);
  FieldBase::~FieldBase((FieldBase *)local_1e0);
  if ((this->m_sessionID).m_isFIXT == true) {
    local_1e0._0_8_ = &PTR__FieldBase_001f8470;
    local_1e0._8_4_ = 0x471;
    pcVar1 = (this->m_senderDefaultApplVerID)._M_dataplus._M_p;
    local_1d0._M_p = local_1c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar1,
               pcVar1 + (this->m_senderDefaultApplVerID)._M_string_length);
    local_1a8 = 0;
    local_1a0._M_local_buf[0] = '\0';
    local_190.m_length = 0;
    local_190.m_checksum = 0;
    local_1e0._0_8_ = &PTR__FieldBase_001fa028;
    local_1b0._M_p = (pointer)&local_1a0;
    FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_1e0,true);
    FieldBase::~FieldBase((FieldBase *)local_1e0);
  }
  if ((this->m_state).m_receivedReset == true) {
    BoolField::BoolField((BoolField *)local_1e0,0x8d,true);
    local_1e0._0_8_ = &PTR__FieldBase_001f9df8;
    FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_1e0,true);
    FieldBase::~FieldBase((FieldBase *)local_1e0);
  }
  field = FieldMap::getFieldRef(&aLogon->super_FieldMap,0x6c);
  FieldMap::setField(&local_188.super_FieldMap,field,true);
  if (this->m_sendNextExpectedMsgSeqNum == true) {
    SVar2 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
    UInt64Field::UInt64Field((UInt64Field *)local_1e0,0x315,SVar2 + 1);
    local_1e0._0_8_ = &PTR__FieldBase_001f9e68;
    FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_1e0,true);
    FieldBase::~FieldBase((FieldBase *)local_1e0);
  }
  fill(this,&local_188.m_header);
  sendRaw(this,&local_188,0);
  (this->m_state).m_sentLogon = true;
  Message::~Message(&local_188);
  return;
}

Assistant:

void Session::generateLogon(const Message &aLogon) {
  Message logon = newMessage(MsgType(MsgType_Logon));

  logon.setField(EncryptMethod(0));
  if (m_sessionID.isFIXT()) {
    logon.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  if (m_state.receivedReset()) {
    logon.setField(ResetSeqNumFlag(true));
  }
  logon.setField(aLogon.getField<HeartBtInt>());
  if (m_sendNextExpectedMsgSeqNum) {
    logon.setField(NextExpectedMsgSeqNum(
        getExpectedTargetNum() + 1)); // +1 because incoming Logon did not increment the target SeqNum yet
  }
  fill(logon.getHeader());
  sendRaw(logon);
  m_state.sentLogon(true);
}